

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O2

string * __thiscall Node::OutputNewDefinition_abi_cxx11_(string *__return_storage_ptr__,Node *this)

{
  bool bVar1;
  int iVar2;
  VariableStruct *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  allocator local_a9;
  char buffer [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar2 = this->Type;
  if (iVar2 - 0x125U < 2) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_00111781:
    bVar1 = false;
  }
  else {
    if (iVar2 == 0x143) {
      OutputNodeVarType_abi_cxx11_(&local_80,this->Tree[0]);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer,
                     &local_80," ");
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)buffer);
      std::__cxx11::string::~string((string *)buffer);
      pbVar3 = &local_80;
LAB_0011177c:
      std::__cxx11::string::~string((string *)pbVar3);
      goto LAB_00111781;
    }
    if (((iVar2 == 0x14e) || (iVar2 == 0x17c)) || (iVar2 == 0x1a1)) {
LAB_001116c6:
      std::__cxx11::string::assign((char *)__return_storage_ptr__);
      goto LAB_00111781;
    }
    bVar1 = true;
    if (iVar2 == 0x1ff) {
      OutputNodeVarType_abi_cxx11_(&local_60,this->Tree[0]);
      std::operator+(&local_80,"extern const ",&local_60);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer,
                     &local_80," ");
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)buffer);
      std::__cxx11::string::~string((string *)buffer);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_60);
    }
    else {
      if (iVar2 == 0x1fe) goto LAB_001116c6;
      if (iVar2 == 0x1fd) {
        std::__cxx11::string::string((string *)&local_60,"extern ",&local_a9);
        OutputNodeVarType_abi_cxx11_(&local_40,this->Tree[0]);
        std::operator+(&local_80,&local_60,&local_40);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer,
                       &local_80," ");
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)buffer);
        std::__cxx11::string::~string((string *)buffer);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_40);
        pbVar3 = &local_60;
        goto LAB_0011177c;
      }
    }
  }
  this_00 = VariableList::Lookup(Variables,&this->Tree[1]->TextValue,this->Tree[3],0);
  if (this_00 == (VariableStruct *)0x0) {
    std::operator+(&local_80,"?",&this->Tree[1]->TextValue);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer,
                   &local_80,"?");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)buffer);
    pbVar3 = &local_80;
  }
  else {
    VariableStruct::GetName_abi_cxx11_((string *)buffer,this_00,0);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer;
  }
  std::__cxx11::string::~string((string *)pbVar3);
  if (this->Type - 0x125U < 2) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (this->Tree[3] == (Node *)0x0) {
    if (bVar1) goto LAB_0011196b;
  }
  else {
    if (bVar1) {
      iVar2 = IsSimpleInteger(this->Tree[3]);
      if (iVar2 == 0) {
        OutputForcedType_abi_cxx11_(&local_60,this->Tree[3],VARTYPE_INTEGER);
        std::operator+(&local_80,"[",&local_60);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer,
                       &local_80," + 1]");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)buffer);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_60);
      }
      else {
        iVar2 = atoi((this->Tree[3]->TextValue)._M_dataplus._M_p);
        sprintf(buffer,"[%d]",(ulong)(iVar2 + 1));
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      goto LAB_0011196b;
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    if (this->Tree[3] == (Node *)0x0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
      OutputDefinitionParams_abi_cxx11_((string *)buffer,this->Tree[3],(Node *)0x0,0x1f5,0);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)buffer);
    }
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_0011196b:
  if (this->Tree[4] != (Node *)0x0) {
    Expression_abi_cxx11_(&local_80,this->Tree[4]);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer," = "
                   ,&local_80);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)buffer);
    std::__cxx11::string::~string((string *)&local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Node::OutputNewDefinition(void)
{
	VariableStruct *ThisVar;
	int IsFunction = 0;
	std::string result;

	//
	// Handle class and type
	//
	switch(Type)
	{
	case BAS_N_EXTERNALFUNCTION:
		IsFunction = 1;
		result = std::string("extern ") + Tree[0]->OutputNodeVarType() + " ";
		break;

	case BAS_N_EXTERNALSUB:
		IsFunction = 1;
		result = "extern void ";
		break;

	case BAS_S_FUNCTION:
		IsFunction = 1;
		result = Tree[0]->OutputNodeVarType() + " ";
		break;

	case BAS_S_DEF:
	case BAS_S_DEFSTAR:
		IsFunction = 1;
		result += "auto ";
		break;

	case BAS_N_EXTERNALCONSTANT:
		result = "extern const " + Tree[0]->OutputNodeVarType() + " ";
		break;

	case BAS_S_SUB:
	case BAS_S_PROGRAM:
		IsFunction = 1;
		result = "void ";
		break;

	case BAS_S_HANDLER:
		IsFunction = 1;
		result = "void ";
		break;
	}

	//
	// Look for variable in table
	//
	ThisVar = Variables->Lookup(Tree[1]->TextValue, Tree[3]);

	//
	// Make up a good name to print for this variable/function
	//
	if (ThisVar != 0)
	{
		result += ThisVar->GetName();
	}
	else
	{
		result += "?" + Tree[1]->TextValue + "?";
	}

	//
	// Lambda function for DEF
	//
	switch(Type)
	{
	case BAS_S_DEF:
	case BAS_S_DEFSTAR:
		result += " = [&]";
		break;
	}

	if (Tree[3] != 0)
	{
		if (IsFunction == 0)
		{
			//
			// Handle references (Function or array)
			// (May need to be modified from x[a,b]
			// to x[a][b] manually.
			//
			if (Tree[3] != 0)
			{
				if (Tree[3]->IsSimpleInteger())
				{
					// FIXME: Isn't there a better way?
					char buffer[16];
					sprintf(buffer, "[%d]",
						(atoi(Tree[3]->TextValue.c_str()) + 1));
					result += buffer;
				}
				else
				{
					result += "[" +
						Tree[3]->OutputForcedType(VARTYPE_INTEGER) + " + 1]";
				}
			}
		}
		else
		{
			//
			// Handle references (Function)
			//
			result += "(";

			if (Tree[3] != 0)
			{
				result += Tree[3]->OutputDefinitionParams(0, BAS_N_LIST);
			}
			else
			{
				result += "...";
			}

			result += ")";
		}
	}
	else
	{
		if (IsFunction != 0)
		{
			result += "(void)";
		}
	}

	//
	// Output any constant definitions
	//
	if (Tree[4] != 0)
	{
		result += " = " + Tree[4]->Expression();
	}

	return result;
}